

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneralProduct.h
# Opt level: O0

void Eigen::internal::gemv_dense_selector<2,0,true>::
     run<Eigen::Ref<Eigen::Matrix<double,_1,_1,0,_1,_1>,0,Eigen::OuterStride<_1>>,Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_1,_1,0,_1,_1>,0,Eigen::OuterStride<_1>>const,_1,1,true>,Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_1,_1,0,_1,_1>,0,Eigen::OuterStride<_1>>,_1,1,true>>
               (Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_> *lhs,
               Block<const_Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,_1,_true>
               *rhs,Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,_1,_true>
                    *dest,Scalar *alpha)

{
  PointerType pdVar1;
  Index rows;
  Index cols;
  Scalar *pSVar2;
  Scalar *pSVar3;
  ScalarWithConstIfNotLvalue *res;
  Scalar SVar4;
  Scalar SVar5;
  const_blas_data_mapper<double,_long,_1> local_108;
  const_blas_data_mapper<double,_long,_0> local_f8;
  Real local_e8;
  RhsScalar compatibleAlpha;
  ResScalar actualAlpha;
  ActualRhsType actualRhs;
  ActualLhsType actualLhs;
  Scalar *alpha_local;
  Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,_1,_true>
  *dest_local;
  Block<const_Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,_1,_true>
  *rhs_local;
  Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_> *lhs_local;
  Scalar *local_a0;
  const_blas_data_mapper<double,_long,_0> *local_98;
  undefined8 local_90;
  Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_> *local_88;
  Scalar *local_80;
  const_blas_data_mapper<double,_long,_0> *local_78;
  Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,_1,_true>
  *local_70;
  Block<const_Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,_1,_true>
  *local_68;
  ActualLhsType local_60;
  Index local_58;
  Scalar *local_50;
  const_blas_data_mapper<double,_long,_1> *local_48;
  Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,_1,_true>
  *local_40;
  Block<const_Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,_1,_true>
  *local_38;
  ActualLhsType local_30;
  undefined8 local_28;
  Index local_20;
  Scalar *local_18;
  const_blas_data_mapper<double,_long,_1> *local_10;
  
  actualLhs = (ActualLhsType)alpha;
  alpha_local = (Scalar *)dest;
  dest_local = (Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,_1,_true>
                *)rhs;
  rhs_local = (Block<const_Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,_1,_true>
               *)lhs;
  actualRhs = (ActualRhsType)
              blas_traits<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>_>
              ::extract(lhs);
  actualAlpha = (ResScalar)
                blas_traits<Eigen::Block<const_Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_-1,_1,_true>_>
                ::extract((Block<const_Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,_1,_true>
                           *)dest_local);
  local_60 = actualLhs;
  local_68 = rhs_local;
  local_70 = dest_local;
  local_30 = actualLhs;
  local_38 = rhs_local;
  local_40 = dest_local;
  pdVar1 = (actualLhs->
           super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
           ).
           super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
           .
           super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
           .m_data;
  SVar4 = blas_traits<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>_>
          ::extractScalarFactor
                    ((Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_> *)
                     rhs_local);
  SVar5 = blas_traits<Eigen::Block<const_Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_-1,_1,_true>_>
          ::extractScalarFactor
                    ((Block<const_Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,_1,_true>
                      *)local_40);
  compatibleAlpha = (double)pdVar1 * SVar4 * SVar5;
  local_e8 = get_factor<double,_double>::run(&compatibleAlpha);
  rows = MapBase<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_0>
         ::rows((MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                 *)actualRhs);
  cols = MapBase<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_0>
         ::cols((MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                 *)actualRhs);
  pSVar2 = MapBase<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_1>
           ::data((MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                   *)actualRhs);
  lhs_local = (Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_> *)
              RefBase<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>_>
              ::outerStride((RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                             *)actualRhs);
  local_98 = &local_f8;
  local_90 = 1;
  local_a0 = pSVar2;
  local_88 = lhs_local;
  local_80 = pSVar2;
  local_78 = local_98;
  local_f8.super_blas_data_mapper<const_double,_long,_0,_0,_1>.m_data = pSVar2;
  local_f8.super_blas_data_mapper<const_double,_long,_0,_0,_1>.m_stride = (long)lhs_local;
  pSVar3 = MapBase<Eigen::Block<const_Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_-1,_1,_true>,_0>
           ::data((MapBase<Eigen::Block<const_Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,_1,_true>,_0>
                   *)actualAlpha);
  local_58 = BlockImpl_dense<const_Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_-1,_1,_true,_true>
             ::innerStride((BlockImpl_dense<const_Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,_1,_true,_true>
                            *)actualAlpha);
  local_48 = &local_108;
  local_28 = 1;
  local_50 = pSVar3;
  local_20 = local_58;
  local_18 = pSVar3;
  local_10 = local_48;
  local_108.super_blas_data_mapper<const_double,_long,_1,_0,_1>.m_data = pSVar3;
  local_108.super_blas_data_mapper<const_double,_long,_1,_0,_1>.m_stride = local_58;
  res = MapBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_-1,_1,_true>,_1>
        ::data((MapBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,_1,_true>,_1>
                *)alpha_local);
  general_matrix_vector_product<long,_double,_Eigen::internal::const_blas_data_mapper<double,_long,_0>,_0,_false,_double,_Eigen::internal::const_blas_data_mapper<double,_long,_1>,_false,_0>
  ::run(rows,cols,&local_f8,&local_108,res,1,local_e8);
  return;
}

Assistant:

static inline void run(const Lhs &lhs, const Rhs &rhs, Dest& dest, const typename Dest::Scalar& alpha)
  {
    typedef typename Lhs::Scalar   LhsScalar;
    typedef typename Rhs::Scalar   RhsScalar;
    typedef typename Dest::Scalar  ResScalar;
    typedef typename Dest::RealScalar  RealScalar;
    
    typedef internal::blas_traits<Lhs> LhsBlasTraits;
    typedef typename LhsBlasTraits::DirectLinearAccessType ActualLhsType;
    typedef internal::blas_traits<Rhs> RhsBlasTraits;
    typedef typename RhsBlasTraits::DirectLinearAccessType ActualRhsType;
  
    typedef Map<Matrix<ResScalar,Dynamic,1>, EIGEN_PLAIN_ENUM_MIN(AlignedMax,internal::packet_traits<ResScalar>::size)> MappedDest;

    ActualLhsType actualLhs = LhsBlasTraits::extract(lhs);
    ActualRhsType actualRhs = RhsBlasTraits::extract(rhs);

    ResScalar actualAlpha = combine_scalar_factors(alpha, lhs, rhs);

    // make sure Dest is a compile-time vector type (bug 1166)
    typedef typename conditional<Dest::IsVectorAtCompileTime, Dest, typename Dest::ColXpr>::type ActualDest;

    enum {
      // FIXME find a way to allow an inner stride on the result if packet_traits<Scalar>::size==1
      // on, the other hand it is good for the cache to pack the vector anyways...
      EvalToDestAtCompileTime = (ActualDest::InnerStrideAtCompileTime==1),
      ComplexByReal = (NumTraits<LhsScalar>::IsComplex) && (!NumTraits<RhsScalar>::IsComplex),
      MightCannotUseDest = ((!EvalToDestAtCompileTime) || ComplexByReal) && (ActualDest::MaxSizeAtCompileTime!=0)
    };

    typedef const_blas_data_mapper<LhsScalar,Index,ColMajor> LhsMapper;
    typedef const_blas_data_mapper<RhsScalar,Index,RowMajor> RhsMapper;
    RhsScalar compatibleAlpha = get_factor<ResScalar,RhsScalar>::run(actualAlpha);

    if(!MightCannotUseDest)
    {
      // shortcut if we are sure to be able to use dest directly,
      // this ease the compiler to generate cleaner and more optimzized code for most common cases
      general_matrix_vector_product
          <Index,LhsScalar,LhsMapper,ColMajor,LhsBlasTraits::NeedToConjugate,RhsScalar,RhsMapper,RhsBlasTraits::NeedToConjugate>::run(
          actualLhs.rows(), actualLhs.cols(),
          LhsMapper(actualLhs.data(), actualLhs.outerStride()),
          RhsMapper(actualRhs.data(), actualRhs.innerStride()),
          dest.data(), 1,
          compatibleAlpha);
    }
    else
    {
      gemv_static_vector_if<ResScalar,ActualDest::SizeAtCompileTime,ActualDest::MaxSizeAtCompileTime,MightCannotUseDest> static_dest;

      const bool alphaIsCompatible = (!ComplexByReal) || (numext::imag(actualAlpha)==RealScalar(0));
      const bool evalToDest = EvalToDestAtCompileTime && alphaIsCompatible;

      ei_declare_aligned_stack_constructed_variable(ResScalar,actualDestPtr,dest.size(),
                                                    evalToDest ? dest.data() : static_dest.data());

      if(!evalToDest)
      {
        #ifdef EIGEN_DENSE_STORAGE_CTOR_PLUGIN
        Index size = dest.size();
        EIGEN_DENSE_STORAGE_CTOR_PLUGIN
        #endif
        if(!alphaIsCompatible)
        {
          MappedDest(actualDestPtr, dest.size()).setZero();
          compatibleAlpha = RhsScalar(1);
        }
        else
          MappedDest(actualDestPtr, dest.size()) = dest;
      }

      general_matrix_vector_product
          <Index,LhsScalar,LhsMapper,ColMajor,LhsBlasTraits::NeedToConjugate,RhsScalar,RhsMapper,RhsBlasTraits::NeedToConjugate>::run(
          actualLhs.rows(), actualLhs.cols(),
          LhsMapper(actualLhs.data(), actualLhs.outerStride()),
          RhsMapper(actualRhs.data(), actualRhs.innerStride()),
          actualDestPtr, 1,
          compatibleAlpha);

      if (!evalToDest)
      {
        if(!alphaIsCompatible)
          dest.matrix() += actualAlpha * MappedDest(actualDestPtr, dest.size());
        else
          dest = MappedDest(actualDestPtr, dest.size());
      }
    }
  }